

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O0

void __thiscall libtorrent::aux::merkle_tree::optimize_storage(merkle_tree *this)

{
  bool bVar1;
  allocator<libtorrent::digest32<256L>_> local_59;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_58;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_50;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_48;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_40;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  local_38;
  undefined1 local_30 [8];
  vector<sha256_hash> new_tree;
  int start;
  merkle_tree *this_local;
  
  if (this->m_mode == full_tree) {
    if (this->m_num_blocks == 1) {
      ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::clear
                (&(this->m_tree).
                  super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                );
      ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
      shrink_to_fit(&(this->m_tree).
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   );
      this->m_mode = empty_tree;
      bitfield::clear(&this->m_block_verified);
    }
    else {
      new_tree.
      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = block_layer_start(this);
      bVar1 = bitfield::all_set(&this->m_block_verified);
      if (bVar1) {
        local_40._M_current =
             (digest32<256L> *)
             ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ::begin(&(this->m_tree).
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    );
        local_38 = __gnu_cxx::
                   __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                   ::operator+(&local_40,
                               (long)new_tree.
                                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                     .
                                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        local_58._M_current =
             (digest32<256L> *)
             ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ::begin(&(this->m_tree).
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    );
        local_50 = __gnu_cxx::
                   __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                   ::operator+(&local_58,
                               (long)new_tree.
                                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                     .
                                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        local_48 = __gnu_cxx::
                   __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                   ::operator+(&local_50,(long)this->m_num_blocks);
        ::std::allocator<libtorrent::digest32<256L>_>::allocator(&local_59);
        container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
        ::
        container_wrapper<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,void>
                  ((container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>
                    *)local_30,local_38,local_48,&local_59);
        ::std::allocator<libtorrent::digest32<256L>_>::~allocator(&local_59);
        container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
        ::operator=(&this->m_tree,
                    (container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                     *)local_30);
        this->m_mode = block_layer;
        bitfield::clear(&this->m_block_verified);
        container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
        ::~container_wrapper
                  ((container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                    *)local_30);
      }
    }
  }
  return;
}

Assistant:

void merkle_tree::optimize_storage()
	{
		INVARIANT_CHECK;
		if (m_mode != mode_t::full_tree) return;

		if (m_num_blocks == 1)
		{
			// if this tree *just* has a root, no need to use any storage for
			// nodes
			m_tree.clear();
			m_tree.shrink_to_fit();
			m_mode = mode_t::empty_tree;
			m_block_verified.clear();
			return;
		}

		int const start = block_layer_start();
		if (m_block_verified.all_set())
		{
			aux::vector<sha256_hash> new_tree(m_tree.begin() + start, m_tree.begin() + start + m_num_blocks);

			m_tree = std::move(new_tree);
			m_mode = mode_t::block_layer;
			m_block_verified.clear();
			return;
		}
	}